

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::parsing::TokenKind>::emplaceRealloc<slang::parsing::TokenKind_const&>
          (SmallVectorBase<slang::parsing::TokenKind> *this,pointer pos,TokenKind *args)

{
  pointer pTVar1;
  ulong uVar2;
  pointer __src;
  pointer __dest;
  size_t __n;
  long lVar3;
  size_type sVar4;
  ulong uVar5;
  
  if (this->len != 0x3fffffffffffffff) {
    uVar5 = this->len + 1;
    uVar2 = this->cap;
    if (uVar5 < uVar2 * 2) {
      uVar5 = uVar2 * 2;
    }
    if (0x3fffffffffffffff - uVar2 < uVar2) {
      uVar5 = 0x3fffffffffffffff;
    }
    lVar3 = (long)pos - (long)this->data_;
    __dest = (pointer)operator_new(uVar5 * 2);
    pTVar1 = (pointer)((long)__dest + lVar3);
    *(TokenKind *)((long)__dest + lVar3) = *args;
    __src = this->data_;
    sVar4 = this->len;
    __n = (long)__src + (sVar4 * 2 - (long)pos);
    if (__n == 0) {
      if (sVar4 != 0) {
        memmove(__dest,__src,sVar4 * 2);
      }
    }
    else {
      if (__src != pos) {
        memmove(__dest,__src,(long)pos - (long)__src);
      }
      memcpy(pTVar1 + 1,pos,__n);
    }
    if (__src != (pointer)this->firstElement) {
      operator_delete(__src);
      sVar4 = this->len;
    }
    this->len = sVar4 + 1;
    this->cap = uVar5;
    this->data_ = __dest;
    return pTVar1;
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}